

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall
Fl_Text_Display::find_line_end
          (Fl_Text_Display *this,int startPos,bool startPosIsLineStart,int *lineEnd,
          int *nextLineStart)

{
  Fl_Text_Buffer *this_00;
  int iVar1;
  int iVar2;
  int retLineStart;
  int retLines;
  
  this_00 = this->mBuffer;
  if (this->mContinuousWrap == 0) {
    iVar1 = Fl_Text_Buffer::line_end(this_00,startPos);
    iVar2 = Fl_Text_Buffer::next_char(this->mBuffer,iVar1);
    *lineEnd = iVar1;
    iVar1 = this->mBuffer->mLength;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
    *nextLineStart = iVar2;
  }
  else {
    wrapped_line_counter
              (this,this_00,startPos,this_00->mLength,1,startPosIsLineStart,0,nextLineStart,
               &retLines,&retLineStart,lineEnd,true);
  }
  return;
}

Assistant:

void Fl_Text_Display::find_line_end(int startPos, bool startPosIsLineStart,
                                    int *lineEnd, int *nextLineStart) const {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  int retLines, retLineStart;

  /* if we're not wrapping use more efficient BufEndOfLine */
  if (!mContinuousWrap) {
    int le = buffer()->line_end(startPos);
    int ls = buffer()->next_char(le);
    *lineEnd = le;
    *nextLineStart = min(buffer()->length(), ls);
    return;
  }

  /* use the wrapped line counter routine to count forward one line */
  wrapped_line_counter(buffer(), startPos, buffer()->length(),
                       1, startPosIsLineStart, 0, nextLineStart, &retLines,
                       &retLineStart, lineEnd);
}